

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random.cpp
# Opt level: O1

Number __thiscall rc::Random::next(Random *this)

{
  Counter CVar1;
  ulong uVar2;
  
  uVar2 = this->m_counter & 3;
  if (uVar2 == 0) {
    mash(this,&this->m_block);
  }
  if (this->m_counter == 0xffffffffffffffff) {
    append(this,true);
    CVar1 = 0;
  }
  else {
    CVar1 = this->m_counter + 1;
  }
  this->m_counter = CVar1;
  return (this->m_block)._M_elems[uVar2];
}

Assistant:

Random::Number Random::next() {
  std::size_t blki = m_counter % std::tuple_size<Block>::value;
  if (blki == 0) {
    mash(m_block);
  }

  if (m_counter == kCounterMax) {
    append(true);
    m_counter = 0;
  } else {
    m_counter++;
  }

  return m_block[blki];
}